

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_tec_surf(REF_GRID ref_grid,char *filename)

{
  FILE *__stream;
  REF_STATUS ref_private_macro_code_rss;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x311,
           "ref_export_tec_surf","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"title=\"tecplot refine geometry file\"\n");
    fprintf(__stream,"variables = \"x\" \"y\" \"z\"\n");
    ref_grid_local._4_4_ = ref_export_tec_surf_zone(ref_grid,(FILE *)__stream);
    if (ref_grid_local._4_4_ == 0) {
      fclose(__stream);
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x316,"ref_export_tec_surf",(ulong)ref_grid_local._4_4_,"surf");
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_export_tec_surf(REF_GRID ref_grid,
                                       const char *filename) {
  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine geometry file\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\"\n");

  RSS(ref_export_tec_surf_zone(ref_grid, file), "surf");

  fclose(file);
  return REF_SUCCESS;
}